

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  string *s;
  size_t __n;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint8 *puVar12;
  uint8 *puVar13;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,(this->package_).ptr_,target)
    ;
  }
  lVar11 = (long)(this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar11) {
    lVar9 = 0;
    do {
      s = (string *)((this->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar9];
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\x1a';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s,target);
      }
      lVar9 = lVar9 + 1;
    } while (lVar11 != lVar9);
  }
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (DescriptorProto *)
                ((this->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar10];
      *target = '\"';
      uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar12 = puVar13 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = DescriptorProto::InternalSerializeWithCachedSizesToArray(this_00,puVar12,stream);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = (EnumDescriptorProto *)
                ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar10];
      *target = '*';
      uVar5 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar12 = puVar13 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(this_01,puVar12,stream);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = (ServiceDescriptorProto *)
                ((this->service_).super_RepeatedPtrFieldBase.rep_)->elements[iVar10];
      *target = '2';
      uVar5 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar12 = puVar13 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_02,puVar12,stream);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_03 = (FieldDescriptorProto *)
                ((this->extension_).super_RepeatedPtrFieldBase.rep_)->elements[iVar10];
      *target = ':';
      uVar5 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar12 = puVar13 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(this_03,puVar12,stream)
      ;
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_04 = this->options_;
    *target = 'B';
    uVar5 = (this_04->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar12 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar12 = target + 3;
      }
      else {
        puVar12 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar13 = puVar12;
          puVar13[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          puVar12 = puVar13 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar4);
        *puVar13 = (uint8)uVar6;
      }
    }
    target = FileOptions::InternalSerializeWithCachedSizesToArray(this_04,puVar12,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_05 = this->source_code_info_;
    *target = 'J';
    uVar5 = (this_05->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar12 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar12 = target + 3;
      }
      else {
        puVar12 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar13 = puVar12;
          puVar13[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          puVar12 = puVar13 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar4);
        *puVar13 = (uint8)uVar6;
      }
    }
    target = SourceCodeInfo::InternalSerializeWithCachedSizesToArray(this_05,puVar12,stream);
  }
  lVar11 = (long)(this->public_dependency_).current_size_;
  if (0 < lVar11) {
    lVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar5 = *(uint *)((long)(this->public_dependency_).arena_or_elements_ + lVar9 * 4);
      *target = 'P';
      if ((ulong)(long)(int)uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        target = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        uVar7 = (ulong)(long)(int)uVar5 >> 7;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)uVar7;
          target = target + 3;
        }
        else {
          target = target + 3;
          do {
            puVar12 = target;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            target = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar4);
          *puVar12 = (uint8)uVar8;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar11);
  }
  lVar11 = (long)(this->weak_dependency_).current_size_;
  if (0 < lVar11) {
    lVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar5 = *(uint *)((long)(this->weak_dependency_).arena_or_elements_ + lVar9 * 4);
      *target = 'X';
      if ((ulong)(long)(int)uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        target = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        uVar7 = (ulong)(long)(int)uVar5 >> 7;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)uVar7;
          target = target + 3;
        }
        else {
          target = target + 3;
          do {
            puVar12 = target;
            puVar12[-1] = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            target = puVar12 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar4);
          *puVar12 = (uint8)uVar8;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar11);
  }
  if ((uVar1 & 4) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,(this->syntax_).ptr_,target);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar12 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
    return puVar12;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}